

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O2

Expression * __thiscall
wasm::TranslateToFuzzReader::makeUnary(TranslateToFuzzReader *this,Type type)

{
  Random *pRVar1;
  BasicType BVar2;
  uint32_t uVar3;
  UnaryOp UVar4;
  Expression *pEVar5;
  FeatureOptions<wasm::UnaryOp> *pFVar6;
  UnaryOp UVar7;
  UnaryOp args_1;
  Type TVar8;
  UnaryOp local_70;
  undefined4 uStack_6c;
  Type singleConcreteType;
  Type local_60;
  Type type_local;
  Expression *pEStack_50;
  _Base_ptr local_48;
  _Base_ptr local_40;
  _Base_ptr local_38;
  size_t local_30;
  
  local_60.id = type.id;
  if ((type.id & 1) != 0 && 6 < type.id) {
    __assert_fail("!type.isTuple()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                  ,0xedb,"Expression *wasm::TranslateToFuzzReader::makeUnary(Type)");
  }
  if ((type.id & 1) == 0 && 6 < type.id) {
    pEVar5 = makeTrivial(this,type);
    return pEVar5;
  }
  BVar2 = Type::getBasic(&local_60);
  switch(BVar2) {
  case none:
  case unreachable:
    ::wasm::handle_unreachable
              ("unexpected type",
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
               ,0xfca);
  case i32:
    _local_70 = getSingleConcreteType(this);
    if ((_local_70 & 1) == 0 && 6 < _local_70) {
      pEVar5 = makeTrivial(this,local_60);
      return pEVar5;
    }
    BVar2 = Type::getBasic((Type *)&stack0xffffffffffffff90);
    switch(BVar2) {
    case none:
    case unreachable:
      ::wasm::handle_unreachable
                ("unexpected type",
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                 ,0xf16);
    case i32:
      local_40 = (_Base_ptr)&pEStack_50;
      type_local.id = 0;
      pEStack_50 = (Expression *)0x0;
      local_48 = (_Base_ptr)0x0;
      local_30 = 0;
      local_38 = local_40;
      pFVar6 = Random::FeatureOptions<wasm::UnaryOp>::add<wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp>
                         ((FeatureOptions<wasm::UnaryOp> *)&type_local,(FeatureSet)0x0,EqZInt32,
                          ClzInt32,CtzInt32,PopcntInt32);
      pFVar6 = Random::FeatureOptions<wasm::UnaryOp>::add<wasm::UnaryOp>
                         (pFVar6,(FeatureSet)0x20,ExtendS8Int32,ExtendS16Int32);
      UVar4 = Random::pick<wasm::UnaryOp>(&this->random,pFVar6);
      std::
      _Rb_tree<wasm::FeatureSet,_std::pair<const_wasm::FeatureSet,_std::vector<wasm::UnaryOp,_std::allocator<wasm::UnaryOp>_>_>,_std::_Select1st<std::pair<const_wasm::FeatureSet,_std::vector<wasm::UnaryOp,_std::allocator<wasm::UnaryOp>_>_>_>,_std::less<wasm::FeatureSet>,_std::allocator<std::pair<const_wasm::FeatureSet,_std::vector<wasm::UnaryOp,_std::allocator<wasm::UnaryOp>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<wasm::FeatureSet,_std::pair<const_wasm::FeatureSet,_std::vector<wasm::UnaryOp,_std::allocator<wasm::UnaryOp>_>_>,_std::_Select1st<std::pair<const_wasm::FeatureSet,_std::vector<wasm::UnaryOp,_std::allocator<wasm::UnaryOp>_>_>_>,_std::less<wasm::FeatureSet>,_std::allocator<std::pair<const_wasm::FeatureSet,_std::vector<wasm::UnaryOp,_std::allocator<wasm::UnaryOp>_>_>_>_>
                   *)&type_local);
      type_local.id._0_4_ = UVar4;
      TVar8.id = 2;
      break;
    case i64:
      UVar7 = EqZInt64;
      UVar4 = WrapInt64;
LAB_00162dfb:
      type_local.id._0_4_ = Random::pick<wasm::UnaryOp,wasm::UnaryOp>(&this->random,UVar7,UVar4);
      goto LAB_00162e00;
    case f32:
      local_40 = (_Base_ptr)&pEStack_50;
      type_local.id = 0;
      pEStack_50 = (Expression *)0x0;
      local_48 = (_Base_ptr)0x0;
      local_30 = 0;
      local_38 = local_40;
      pFVar6 = Random::FeatureOptions<wasm::UnaryOp>::add<wasm::UnaryOp,wasm::UnaryOp>
                         ((FeatureOptions<wasm::UnaryOp> *)&type_local,(FeatureSet)0x0,
                          TruncSFloat32ToInt32,TruncUFloat32ToInt32,ReinterpretFloat32);
      pFVar6 = Random::FeatureOptions<wasm::UnaryOp>::add<wasm::UnaryOp>
                         (pFVar6,(FeatureSet)0x4,TruncSatSFloat32ToInt32,TruncSatUFloat32ToInt32);
      UVar4 = Random::pick<wasm::UnaryOp>(&this->random,pFVar6);
LAB_00162e6d:
      std::
      _Rb_tree<wasm::FeatureSet,_std::pair<const_wasm::FeatureSet,_std::vector<wasm::UnaryOp,_std::allocator<wasm::UnaryOp>_>_>,_std::_Select1st<std::pair<const_wasm::FeatureSet,_std::vector<wasm::UnaryOp,_std::allocator<wasm::UnaryOp>_>_>_>,_std::less<wasm::FeatureSet>,_std::allocator<std::pair<const_wasm::FeatureSet,_std::vector<wasm::UnaryOp,_std::allocator<wasm::UnaryOp>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<wasm::FeatureSet,_std::pair<const_wasm::FeatureSet,_std::vector<wasm::UnaryOp,_std::allocator<wasm::UnaryOp>_>_>,_std::_Select1st<std::pair<const_wasm::FeatureSet,_std::vector<wasm::UnaryOp,_std::allocator<wasm::UnaryOp>_>_>_>,_std::less<wasm::FeatureSet>,_std::allocator<std::pair<const_wasm::FeatureSet,_std::vector<wasm::UnaryOp,_std::allocator<wasm::UnaryOp>_>_>_>_>
                   *)&type_local);
      type_local.id._0_4_ = UVar4;
      TVar8.id = 4;
      break;
    case f64:
      local_40 = (_Base_ptr)&pEStack_50;
      type_local.id = 0;
      pEStack_50 = (Expression *)0x0;
      local_48 = (_Base_ptr)0x0;
      local_30 = 0;
      local_38 = local_40;
      pFVar6 = Random::FeatureOptions<wasm::UnaryOp>::add<wasm::UnaryOp>
                         ((FeatureOptions<wasm::UnaryOp> *)&type_local,(FeatureSet)0x0,
                          TruncSFloat64ToInt32,TruncUFloat64ToInt32);
      pFVar6 = Random::FeatureOptions<wasm::UnaryOp>::add<wasm::UnaryOp>
                         (pFVar6,(FeatureSet)0x4,TruncSatSFloat64ToInt32,TruncSatUFloat64ToInt32);
      UVar4 = Random::pick<wasm::UnaryOp>(&this->random,pFVar6);
LAB_00162dd8:
      std::
      _Rb_tree<wasm::FeatureSet,_std::pair<const_wasm::FeatureSet,_std::vector<wasm::UnaryOp,_std::allocator<wasm::UnaryOp>_>_>,_std::_Select1st<std::pair<const_wasm::FeatureSet,_std::vector<wasm::UnaryOp,_std::allocator<wasm::UnaryOp>_>_>_>,_std::less<wasm::FeatureSet>,_std::allocator<std::pair<const_wasm::FeatureSet,_std::vector<wasm::UnaryOp,_std::allocator<wasm::UnaryOp>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<wasm::FeatureSet,_std::pair<const_wasm::FeatureSet,_std::vector<wasm::UnaryOp,_std::allocator<wasm::UnaryOp>_>_>,_std::_Select1st<std::pair<const_wasm::FeatureSet,_std::vector<wasm::UnaryOp,_std::allocator<wasm::UnaryOp>_>_>_>,_std::less<wasm::FeatureSet>,_std::allocator<std::pair<const_wasm::FeatureSet,_std::vector<wasm::UnaryOp,_std::allocator<wasm::UnaryOp>_>_>_>_>
                   *)&type_local);
      type_local.id._0_4_ = UVar4;
      TVar8.id = 5;
      break;
    case v128:
      if (((this->wasm->features).features & 8) == 0) {
        __assert_fail("wasm.features.hasSIMD()",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                      ,0xf07,"Expression *wasm::TranslateToFuzzReader::makeUnary(Type)");
      }
      local_40 = (_Base_ptr)&pEStack_50;
      type_local.id = 0;
      pEStack_50 = (Expression *)0x0;
      local_48 = (_Base_ptr)0x0;
      local_30 = 0;
      local_38 = local_40;
      pFVar6 = Random::FeatureOptions<wasm::UnaryOp>::
               add<wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp>
                         ((FeatureOptions<wasm::UnaryOp> *)&type_local,(FeatureSet)0x8,AnyTrueVec128
                          ,AllTrueVecI8x16,AllTrueVecI16x8,AllTrueVecI32x4,AllTrueVecI64x2,
                          BitmaskVecI8x16,BitmaskVecI16x8,BitmaskVecI32x4,BitmaskVecI64x2);
      UVar4 = Random::pick<wasm::UnaryOp>(&this->random,pFVar6);
      std::
      _Rb_tree<wasm::FeatureSet,_std::pair<const_wasm::FeatureSet,_std::vector<wasm::UnaryOp,_std::allocator<wasm::UnaryOp>_>_>,_std::_Select1st<std::pair<const_wasm::FeatureSet,_std::vector<wasm::UnaryOp,_std::allocator<wasm::UnaryOp>_>_>_>,_std::less<wasm::FeatureSet>,_std::allocator<std::pair<const_wasm::FeatureSet,_std::vector<wasm::UnaryOp,_std::allocator<wasm::UnaryOp>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<wasm::FeatureSet,_std::pair<const_wasm::FeatureSet,_std::vector<wasm::UnaryOp,_std::allocator<wasm::UnaryOp>_>_>,_std::_Select1st<std::pair<const_wasm::FeatureSet,_std::vector<wasm::UnaryOp,_std::allocator<wasm::UnaryOp>_>_>_>,_std::less<wasm::FeatureSet>,_std::allocator<std::pair<const_wasm::FeatureSet,_std::vector<wasm::UnaryOp,_std::allocator<wasm::UnaryOp>_>_>_>_>
                   *)&type_local);
      type_local.id._0_4_ = UVar4;
      TVar8.id = 6;
      break;
    default:
      ::wasm::handle_unreachable
                ("invalid type",
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                 ,0xf18);
    }
LAB_00162e81:
    pEStack_50 = make(this,TVar8);
    goto LAB_00162e95;
  case i64:
    pRVar1 = &this->random;
    uVar3 = Random::upTo(pRVar1,4);
    switch(uVar3) {
    case 0:
      local_40 = (_Base_ptr)&pEStack_50;
      type_local.id = 0;
      pEStack_50 = (Expression *)0x0;
      local_48 = (_Base_ptr)0x0;
      local_30 = 0;
      local_38 = local_40;
      pFVar6 = Random::FeatureOptions<wasm::UnaryOp>::add<wasm::UnaryOp,wasm::UnaryOp>
                         ((FeatureOptions<wasm::UnaryOp> *)&type_local,(FeatureSet)0x0,ClzInt64,
                          CtzInt64,PopcntInt64);
      pFVar6 = Random::FeatureOptions<wasm::UnaryOp>::add<wasm::UnaryOp,wasm::UnaryOp>
                         (pFVar6,(FeatureSet)0x20,ExtendS8Int64,ExtendS16Int64,ExtendS32Int64);
      UVar4 = Random::pick<wasm::UnaryOp>(pRVar1,pFVar6);
      std::
      _Rb_tree<wasm::FeatureSet,_std::pair<const_wasm::FeatureSet,_std::vector<wasm::UnaryOp,_std::allocator<wasm::UnaryOp>_>_>,_std::_Select1st<std::pair<const_wasm::FeatureSet,_std::vector<wasm::UnaryOp,_std::allocator<wasm::UnaryOp>_>_>_>,_std::less<wasm::FeatureSet>,_std::allocator<std::pair<const_wasm::FeatureSet,_std::vector<wasm::UnaryOp,_std::allocator<wasm::UnaryOp>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<wasm::FeatureSet,_std::pair<const_wasm::FeatureSet,_std::vector<wasm::UnaryOp,_std::allocator<wasm::UnaryOp>_>_>,_std::_Select1st<std::pair<const_wasm::FeatureSet,_std::vector<wasm::UnaryOp,_std::allocator<wasm::UnaryOp>_>_>_>,_std::less<wasm::FeatureSet>,_std::allocator<std::pair<const_wasm::FeatureSet,_std::vector<wasm::UnaryOp,_std::allocator<wasm::UnaryOp>_>_>_>_>
                   *)&type_local);
      type_local.id._0_4_ = UVar4;
      TVar8.id = 3;
      goto LAB_00162e81;
    case 1:
      UVar4 = ExtendSInt32;
      UVar7 = ExtendUInt32;
LAB_00162b71:
      type_local.id._0_4_ = Random::pick<wasm::UnaryOp,wasm::UnaryOp>(&this->random,UVar4,UVar7);
LAB_00162b8d:
      TVar8.id = 2;
      break;
    case 2:
      local_40 = (_Base_ptr)&pEStack_50;
      type_local.id = 0;
      pEStack_50 = (Expression *)0x0;
      local_48 = (_Base_ptr)0x0;
      local_30 = 0;
      local_38 = local_40;
      pFVar6 = Random::FeatureOptions<wasm::UnaryOp>::add<wasm::UnaryOp>
                         ((FeatureOptions<wasm::UnaryOp> *)&type_local,(FeatureSet)0x0,
                          TruncSFloat32ToInt64,TruncUFloat32ToInt64);
      pFVar6 = Random::FeatureOptions<wasm::UnaryOp>::add<wasm::UnaryOp>
                         (pFVar6,(FeatureSet)0x4,TruncSatSFloat32ToInt64,TruncSatUFloat32ToInt64);
      UVar4 = Random::pick<wasm::UnaryOp>(pRVar1,pFVar6);
      goto LAB_00162e6d;
    case 3:
      local_40 = (_Base_ptr)&pEStack_50;
      type_local.id = 0;
      pEStack_50 = (Expression *)0x0;
      local_48 = (_Base_ptr)0x0;
      local_30 = 0;
      local_38 = local_40;
      pFVar6 = Random::FeatureOptions<wasm::UnaryOp>::add<wasm::UnaryOp,wasm::UnaryOp>
                         ((FeatureOptions<wasm::UnaryOp> *)&type_local,(FeatureSet)0x0,
                          TruncSFloat64ToInt64,TruncUFloat64ToInt64,ReinterpretFloat64);
      pFVar6 = Random::FeatureOptions<wasm::UnaryOp>::add<wasm::UnaryOp>
                         (pFVar6,(FeatureSet)0x4,TruncSatSFloat64ToInt64,TruncSatUFloat64ToInt64);
      UVar4 = Random::pick<wasm::UnaryOp>(pRVar1,pFVar6);
      goto LAB_00162dd8;
    default:
      ::wasm::handle_unreachable
                ("invalid value",
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                 ,0xf3e);
    }
    break;
  case f32:
    uVar3 = Random::upTo(&this->random,4);
    switch(uVar3) {
    case 0:
      type_local.id._0_4_ =
           Random::
           pick<wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp>
                     (&this->random,NegFloat32,AbsFloat32,CeilFloat32,FloorFloat32,TruncFloat32,
                      NearestFloat32,SqrtFloat32);
LAB_00162ce6:
      TVar8.id = 4;
      break;
    case 1:
      UVar4 = ConvertUInt32ToFloat32;
      UVar7 = ConvertSInt32ToFloat32;
      args_1 = ReinterpretInt32;
LAB_00162b84:
      type_local.id._0_4_ =
           Random::pick<wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp>(&this->random,UVar4,UVar7,args_1)
      ;
      goto LAB_00162b8d;
    case 2:
      UVar7 = ConvertUInt64ToFloat32;
      UVar4 = ConvertSInt64ToFloat32;
      goto LAB_00162dfb;
    case 3:
      type_local.id._0_4_ = 0x2c;
LAB_00162cf8:
      TVar8.id = 5;
      break;
    default:
      ::wasm::handle_unreachable
                ("invalid value",
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                 ,0xf57);
    }
    break;
  case f64:
    pRVar1 = &this->random;
    uVar3 = Random::upTo(pRVar1,4);
    switch(uVar3) {
    case 0:
      type_local.id._0_4_ =
           Random::
           pick<wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp>
                     (pRVar1,NegFloat64,AbsFloat64,CeilFloat64,FloorFloat64,TruncFloat64,
                      NearestFloat64,SqrtFloat64);
      goto LAB_00162cf8;
    case 1:
      UVar4 = ConvertUInt32ToFloat64;
      UVar7 = ConvertSInt32ToFloat64;
      goto LAB_00162b71;
    case 2:
      type_local.id._0_4_ =
           Random::pick<wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp>
                     (pRVar1,ConvertUInt64ToFloat64,ConvertSInt64ToFloat64,ReinterpretInt64);
      break;
    case 3:
      type_local.id._0_4_ = 0x2b;
      goto LAB_00162ce6;
    default:
      ::wasm::handle_unreachable
                ("invalid value",
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                 ,0xf70);
    }
LAB_00162e00:
    goto LAB_00162e07;
  case v128:
    if (((this->wasm->features).features & 8) == 0) {
      __assert_fail("wasm.features.hasSIMD()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                    ,0xf73,"Expression *wasm::TranslateToFuzzReader::makeUnary(Type)");
    }
    uVar3 = Random::upTo(&this->random,5);
    switch(uVar3) {
    case 0:
      UVar4 = SplatVecI8x16;
      UVar7 = SplatVecI16x8;
      args_1 = SplatVecI32x4;
      goto LAB_00162b84;
    case 1:
      type_local.id._0_4_ = 0x3f;
      break;
    case 2:
      type_local.id._0_4_ = 0x40;
      goto LAB_00162ce6;
    case 3:
      type_local.id._0_4_ = 0x41;
      goto LAB_00162cf8;
    case 4:
      local_40 = (_Base_ptr)&pEStack_50;
      type_local.id = 0;
      pEStack_50 = (Expression *)0x0;
      local_48 = (_Base_ptr)0x0;
      local_30 = 0;
      local_38 = local_40;
      pFVar6 = Random::FeatureOptions<wasm::UnaryOp>::
               add<wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp>
                         ((FeatureOptions<wasm::UnaryOp> *)&type_local,(FeatureSet)0x8,NotVec128,
                          AbsVecI8x16,AbsVecI16x8,AbsVecI32x4,AbsVecI64x2,PopcntVecI8x16,NegVecI8x16
                          ,NegVecI16x8,NegVecI32x4,NegVecI64x2,AbsVecF32x4,NegVecF32x4,SqrtVecF32x4,
                          CeilVecF32x4,FloorVecF32x4,TruncVecF32x4,NearestVecF32x4,AbsVecF64x2,
                          NegVecF64x2,SqrtVecF64x2,CeilVecF64x2,FloorVecF64x2,TruncVecF64x2,
                          NearestVecF64x2,ExtAddPairwiseSVecI8x16ToI16x8,
                          ExtAddPairwiseUVecI8x16ToI16x8,ExtAddPairwiseSVecI16x8ToI32x4,
                          ExtAddPairwiseUVecI16x8ToI32x4,TruncSatSVecF32x4ToVecI32x4,
                          TruncSatUVecF32x4ToVecI32x4,ConvertSVecI32x4ToVecF32x4,
                          ConvertUVecI32x4ToVecF32x4,ExtendLowSVecI8x16ToVecI16x8,
                          ExtendHighSVecI8x16ToVecI16x8,ExtendLowUVecI8x16ToVecI16x8,
                          ExtendHighUVecI8x16ToVecI16x8,ExtendLowSVecI16x8ToVecI32x4,
                          ExtendHighSVecI16x8ToVecI32x4,ExtendLowUVecI16x8ToVecI32x4,
                          ExtendHighUVecI16x8ToVecI32x4,ExtendLowSVecI32x4ToVecI64x2,
                          ExtendHighSVecI32x4ToVecI64x2,ExtendLowUVecI32x4ToVecI64x2,
                          ExtendHighUVecI32x4ToVecI64x2,ConvertLowSVecI32x4ToVecF64x2,
                          ConvertLowUVecI32x4ToVecF64x2,TruncSatZeroSVecF64x2ToVecI32x4,
                          TruncSatZeroUVecF64x2ToVecI32x4,DemoteZeroVecF64x2ToVecF32x4,
                          PromoteLowVecF32x4ToVecF64x2);
      pFVar6 = Random::FeatureOptions<wasm::UnaryOp>::add<wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp>
                         (pFVar6,(FeatureSet)0x1000,RelaxedTruncSVecF32x4ToVecI32x4,
                          RelaxedTruncUVecF32x4ToVecI32x4,RelaxedTruncZeroSVecF64x2ToVecI32x4,
                          RelaxedTruncZeroUVecF64x2ToVecI32x4);
      pFVar6 = Random::FeatureOptions<wasm::UnaryOp>::
               add<wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp,wasm::UnaryOp>
                         (pFVar6,(FeatureSet)0x40000,AbsVecF16x8,NegVecF16x8,SqrtVecF16x8,
                          CeilVecF16x8,FloorVecF16x8,TruncVecF16x8,NearestVecF16x8,
                          TruncSatSVecF16x8ToVecI16x8,TruncSatUVecF16x8ToVecI16x8,
                          ConvertSVecI16x8ToVecF16x8,ConvertUVecI16x8ToVecF16x8);
      local_70 = Random::pick<wasm::UnaryOp>(&this->random,pFVar6);
      singleConcreteType.id = (uintptr_t)make(this,(Type)0x6);
      pEVar5 = buildUnary(this,(UnaryArgs *)&stack0xffffffffffffff90);
      std::
      _Rb_tree<wasm::FeatureSet,_std::pair<const_wasm::FeatureSet,_std::vector<wasm::UnaryOp,_std::allocator<wasm::UnaryOp>_>_>,_std::_Select1st<std::pair<const_wasm::FeatureSet,_std::vector<wasm::UnaryOp,_std::allocator<wasm::UnaryOp>_>_>_>,_std::less<wasm::FeatureSet>,_std::allocator<std::pair<const_wasm::FeatureSet,_std::vector<wasm::UnaryOp,_std::allocator<wasm::UnaryOp>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<wasm::FeatureSet,_std::pair<const_wasm::FeatureSet,_std::vector<wasm::UnaryOp,_std::allocator<wasm::UnaryOp>_>_>,_std::_Select1st<std::pair<const_wasm::FeatureSet,_std::vector<wasm::UnaryOp,_std::allocator<wasm::UnaryOp>_>_>_>,_std::less<wasm::FeatureSet>,_std::allocator<std::pair<const_wasm::FeatureSet,_std::vector<wasm::UnaryOp,_std::allocator<wasm::UnaryOp>_>_>_>_>
                   *)&type_local);
      return pEVar5;
    default:
      ::wasm::handle_unreachable
                ("invalid value",
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                 ,0xfc6);
    }
LAB_00162e07:
    TVar8.id = 3;
    break;
  default:
    ::wasm::handle_unreachable
              ("invalid type",
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
               ,0xfcc);
  }
  pEStack_50 = make(this,TVar8);
LAB_00162e95:
  pEVar5 = buildUnary(this,(UnaryArgs *)&type_local);
  return pEVar5;
}

Assistant:

Expression* TranslateToFuzzReader::makeUnary(Type type) {
  assert(!type.isTuple());
  // There are no unary ops for reference types.
  // TODO: not quite true if you count struct.new and array.new.
  if (type.isRef()) {
    return makeTrivial(type);
  }
  switch (type.getBasic()) {
    case Type::i32: {
      auto singleConcreteType = getSingleConcreteType();
      if (singleConcreteType.isRef()) {
        // TODO: Do something more interesting here.
        return makeTrivial(type);
      }
      switch (singleConcreteType.getBasic()) {
        case Type::i32: {
          auto op = pick(
            FeatureOptions<UnaryOp>()
              .add(FeatureSet::MVP, EqZInt32, ClzInt32, CtzInt32, PopcntInt32)
              .add(FeatureSet::SignExt, ExtendS8Int32, ExtendS16Int32));
          return buildUnary({op, make(Type::i32)});
        }
        case Type::i64:
          return buildUnary({pick(EqZInt64, WrapInt64), make(Type::i64)});
        case Type::f32: {
          auto op = pick(FeatureOptions<UnaryOp>()
                           .add(FeatureSet::MVP,
                                TruncSFloat32ToInt32,
                                TruncUFloat32ToInt32,
                                ReinterpretFloat32)
                           .add(FeatureSet::TruncSat,
                                TruncSatSFloat32ToInt32,
                                TruncSatUFloat32ToInt32));
          return buildUnary({op, make(Type::f32)});
        }
        case Type::f64: {
          auto op = pick(
            FeatureOptions<UnaryOp>()
              .add(FeatureSet::MVP, TruncSFloat64ToInt32, TruncUFloat64ToInt32)
              .add(FeatureSet::TruncSat,
                   TruncSatSFloat64ToInt32,
                   TruncSatUFloat64ToInt32));
          return buildUnary({op, make(Type::f64)});
        }
        case Type::v128: {
          assert(wasm.features.hasSIMD());
          auto op = pick(FeatureOptions<UnaryOp>().add(FeatureSet::SIMD,
                                                       AnyTrueVec128,
                                                       AllTrueVecI8x16,
                                                       AllTrueVecI16x8,
                                                       AllTrueVecI32x4,
                                                       AllTrueVecI64x2,
                                                       BitmaskVecI8x16,
                                                       BitmaskVecI16x8,
                                                       BitmaskVecI32x4,
                                                       BitmaskVecI64x2));
          return buildUnary({op, make(Type::v128)});
        }
        case Type::none:
        case Type::unreachable:
          WASM_UNREACHABLE("unexpected type");
      }
      WASM_UNREACHABLE("invalid type");
    }
    case Type::i64: {
      switch (upTo(4)) {
        case 0: {
          auto op =
            pick(FeatureOptions<UnaryOp>()
                   .add(FeatureSet::MVP, ClzInt64, CtzInt64, PopcntInt64)
                   .add(FeatureSet::SignExt,
                        ExtendS8Int64,
                        ExtendS16Int64,
                        ExtendS32Int64));
          return buildUnary({op, make(Type::i64)});
        }
        case 1:
          return buildUnary(
            {pick(ExtendSInt32, ExtendUInt32), make(Type::i32)});
        case 2: {
          auto op = pick(
            FeatureOptions<UnaryOp>()
              .add(FeatureSet::MVP, TruncSFloat32ToInt64, TruncUFloat32ToInt64)
              .add(FeatureSet::TruncSat,
                   TruncSatSFloat32ToInt64,
                   TruncSatUFloat32ToInt64));
          return buildUnary({op, make(Type::f32)});
        }
        case 3: {
          auto op = pick(FeatureOptions<UnaryOp>()
                           .add(FeatureSet::MVP,
                                TruncSFloat64ToInt64,
                                TruncUFloat64ToInt64,
                                ReinterpretFloat64)
                           .add(FeatureSet::TruncSat,
                                TruncSatSFloat64ToInt64,
                                TruncSatUFloat64ToInt64));
          return buildUnary({op, make(Type::f64)});
        }
      }
      WASM_UNREACHABLE("invalid value");
    }
    case Type::f32: {
      switch (upTo(4)) {
        case 0:
          return buildUnary({pick(NegFloat32,
                                  AbsFloat32,
                                  CeilFloat32,
                                  FloorFloat32,
                                  TruncFloat32,
                                  NearestFloat32,
                                  SqrtFloat32),
                             make(Type::f32)});
        case 1:
          return buildUnary({pick(ConvertUInt32ToFloat32,
                                  ConvertSInt32ToFloat32,
                                  ReinterpretInt32),
                             make(Type::i32)});
        case 2:
          return buildUnary(
            {pick(ConvertUInt64ToFloat32, ConvertSInt64ToFloat32),
             make(Type::i64)});
        case 3:
          return buildUnary({DemoteFloat64, make(Type::f64)});
      }
      WASM_UNREACHABLE("invalid value");
    }
    case Type::f64: {
      switch (upTo(4)) {
        case 0:
          return buildUnary({pick(NegFloat64,
                                  AbsFloat64,
                                  CeilFloat64,
                                  FloorFloat64,
                                  TruncFloat64,
                                  NearestFloat64,
                                  SqrtFloat64),
                             make(Type::f64)});
        case 1:
          return buildUnary(
            {pick(ConvertUInt32ToFloat64, ConvertSInt32ToFloat64),
             make(Type::i32)});
        case 2:
          return buildUnary({pick(ConvertUInt64ToFloat64,
                                  ConvertSInt64ToFloat64,
                                  ReinterpretInt64),
                             make(Type::i64)});
        case 3:
          return buildUnary({PromoteFloat32, make(Type::f32)});
      }
      WASM_UNREACHABLE("invalid value");
    }
    case Type::v128: {
      assert(wasm.features.hasSIMD());
      switch (upTo(5)) {
        case 0:
          return buildUnary({pick(SplatVecI8x16, SplatVecI16x8, SplatVecI32x4),
                             make(Type::i32)});
        case 1:
          return buildUnary({SplatVecI64x2, make(Type::i64)});
        case 2:
          return buildUnary({SplatVecF32x4, make(Type::f32)});
        case 3:
          return buildUnary({SplatVecF64x2, make(Type::f64)});
        case 4:
          return buildUnary({pick(FeatureOptions<UnaryOp>()
                                    .add(FeatureSet::SIMD,
                                         NotVec128,
                                         AbsVecI8x16,
                                         AbsVecI16x8,
                                         AbsVecI32x4,
                                         AbsVecI64x2,
                                         PopcntVecI8x16,
                                         NegVecI8x16,
                                         NegVecI16x8,
                                         NegVecI32x4,
                                         NegVecI64x2,
                                         AbsVecF32x4,
                                         NegVecF32x4,
                                         SqrtVecF32x4,
                                         CeilVecF32x4,
                                         FloorVecF32x4,
                                         TruncVecF32x4,
                                         NearestVecF32x4,
                                         AbsVecF64x2,
                                         NegVecF64x2,
                                         SqrtVecF64x2,
                                         CeilVecF64x2,
                                         FloorVecF64x2,
                                         TruncVecF64x2,
                                         NearestVecF64x2,
                                         ExtAddPairwiseSVecI8x16ToI16x8,
                                         ExtAddPairwiseUVecI8x16ToI16x8,
                                         ExtAddPairwiseSVecI16x8ToI32x4,
                                         ExtAddPairwiseUVecI16x8ToI32x4,
                                         TruncSatSVecF32x4ToVecI32x4,
                                         TruncSatUVecF32x4ToVecI32x4,
                                         ConvertSVecI32x4ToVecF32x4,
                                         ConvertUVecI32x4ToVecF32x4,
                                         ExtendLowSVecI8x16ToVecI16x8,
                                         ExtendHighSVecI8x16ToVecI16x8,
                                         ExtendLowUVecI8x16ToVecI16x8,
                                         ExtendHighUVecI8x16ToVecI16x8,
                                         ExtendLowSVecI16x8ToVecI32x4,
                                         ExtendHighSVecI16x8ToVecI32x4,
                                         ExtendLowUVecI16x8ToVecI32x4,
                                         ExtendHighUVecI16x8ToVecI32x4,
                                         ExtendLowSVecI32x4ToVecI64x2,
                                         ExtendHighSVecI32x4ToVecI64x2,
                                         ExtendLowUVecI32x4ToVecI64x2,
                                         ExtendHighUVecI32x4ToVecI64x2,
                                         ConvertLowSVecI32x4ToVecF64x2,
                                         ConvertLowUVecI32x4ToVecF64x2,
                                         TruncSatZeroSVecF64x2ToVecI32x4,
                                         TruncSatZeroUVecF64x2ToVecI32x4,
                                         DemoteZeroVecF64x2ToVecF32x4,
                                         PromoteLowVecF32x4ToVecF64x2)
                                    .add(FeatureSet::RelaxedSIMD,
                                         RelaxedTruncSVecF32x4ToVecI32x4,
                                         RelaxedTruncUVecF32x4ToVecI32x4,
                                         RelaxedTruncZeroSVecF64x2ToVecI32x4,
                                         RelaxedTruncZeroUVecF64x2ToVecI32x4)
                                    .add(FeatureSet::FP16,
                                         AbsVecF16x8,
                                         NegVecF16x8,
                                         SqrtVecF16x8,
                                         CeilVecF16x8,
                                         FloorVecF16x8,
                                         TruncVecF16x8,
                                         NearestVecF16x8,
                                         TruncSatSVecF16x8ToVecI16x8,
                                         TruncSatUVecF16x8ToVecI16x8,
                                         ConvertSVecI16x8ToVecF16x8,
                                         ConvertUVecI16x8ToVecF16x8)),
                             make(Type::v128)});
      }
      WASM_UNREACHABLE("invalid value");
    }
    case Type::none:
    case Type::unreachable:
      WASM_UNREACHABLE("unexpected type");
  }
  WASM_UNREACHABLE("invalid type");
}